

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec_vproc.cpp
# Opt level: O0

MPP_RET dec_vproc_config_dei_v2(MppDecVprocCtxImpl *ctx,MppFrame frm,IEP2_DIL_MODE dil_mode)

{
  iep_com_ops *piVar1;
  int iVar2;
  RK_U32 RVar3;
  uint uVar4;
  MppBuffer pvVar5;
  uint local_90;
  uint local_88;
  RK_U32 is_tff;
  RK_U32 fo_from_iep;
  RK_U32 fo_from_syntax;
  RK_U32 mode;
  iep_com_ops *ops;
  iep2_api_params params;
  IepImg img;
  RK_S32 fd;
  MppBuffer buf;
  MPP_RET ret;
  IEP2_DIL_MODE dil_mode_local;
  MppFrame frm_local;
  MppDecVprocCtxImpl *ctx_local;
  
  piVar1 = ctx->com_ctx->ops;
  if (frm == (MppFrame)0x0) {
    _mpp_log_l(2,"mpp_dec_vproc","found NULL pointer frm\n",(char *)0x0);
    return MPP_ERR_NULL_PTR;
  }
  if ((ctx->out_buf0 == (MppBuffer)0x0) || (ctx->out_buf1 == (MppBuffer)0x0)) {
    _mpp_log_l(2,"mpp_dec_vproc","found NULL pointer out_buf0 %p out_buf1 %p\n",(char *)0x0,
               ctx->out_buf0,ctx->out_buf1);
    return MPP_ERR_NULL_PTR;
  }
  dec_vproc_set_img_fmt((IepImg *)((long)&params.param + 0x14),frm);
  if ((vproc_debug & 0x10) != 0) {
    dump_mppbuffer((MppBuffer)0x0,"/data/dump/dump_in.yuv",(uint)img.act_w,(uint)img.act_h);
  }
  if ((vproc_debug & 2) != 0) {
    _mpp_log_l(4,"mpp_dec_vproc","set dil_mode %d\n","dec_vproc_config_dei_v2",(ulong)dil_mode);
  }
  if (dil_mode - IEP2_DIL_MODE_I5O2 < 3) {
LAB_001a0bc1:
    pvVar5 = mpp_frame_get_buffer(ctx->prev_frm0);
    iVar2 = mpp_buffer_get_fd_with_caller(pvVar5,"dec_vproc_config_dei_v2");
    dec_vproc_set_img(ctx,(IepImg *)((long)&params.param + 0x14),iVar2,IEP_CMD_SET_SRC);
    pvVar5 = mpp_frame_get_buffer(frm);
    iVar2 = mpp_buffer_get_fd_with_caller(pvVar5,"dec_vproc_config_dei_v2");
    dec_vproc_set_img(ctx,(IepImg *)((long)&params.param + 0x14),iVar2,IEP_CMD_SET_DEI_SRC1);
    pvVar5 = mpp_frame_get_buffer(ctx->prev_frm1);
    iVar2 = mpp_buffer_get_fd_with_caller(pvVar5,"dec_vproc_config_dei_v2");
    dec_vproc_set_img(ctx,(IepImg *)((long)&params.param + 0x14),iVar2,IEP_CMD_SET_DEI_SRC2);
  }
  else {
    if (2 < dil_mode - IEP2_DIL_MODE_I2O2) {
      if (dil_mode == IEP2_DIL_MODE_PD) {
        pvVar5 = mpp_frame_get_buffer(frm);
        img.uv_addr = mpp_buffer_get_fd_with_caller(pvVar5,"dec_vproc_config_dei_v2");
        dec_vproc_set_img(ctx,(IepImg *)((long)&params.param + 0x14),img.uv_addr,
                          IEP_CMD_SET_DEI_SRC1);
        if (ctx->prev_frm0 == (MppFrame)0x0) {
          if (ctx->prev_frm1 != (MppFrame)0x0) {
            pvVar5 = mpp_frame_get_buffer(ctx->prev_frm1);
            img.uv_addr = mpp_buffer_get_fd_with_caller(pvVar5,"dec_vproc_config_dei_v2");
          }
        }
        else {
          pvVar5 = mpp_frame_get_buffer(ctx->prev_frm0);
          img.uv_addr = mpp_buffer_get_fd_with_caller(pvVar5,"dec_vproc_config_dei_v2");
        }
        dec_vproc_set_img(ctx,(IepImg *)((long)&params.param + 0x14),img.uv_addr,IEP_CMD_SET_SRC);
        dec_vproc_set_img(ctx,(IepImg *)((long)&params.param + 0x14),img.uv_addr,
                          IEP_CMD_SET_DEI_SRC2);
        goto LAB_001a0da3;
      }
      if ((dil_mode != IEP2_DIL_MODE_BYPASS) && (dil_mode == IEP2_DIL_MODE_DECT)) goto LAB_001a0bc1;
    }
    pvVar5 = mpp_frame_get_buffer(frm);
    iVar2 = mpp_buffer_get_fd_with_caller(pvVar5,"dec_vproc_config_dei_v2");
    dec_vproc_set_img(ctx,(IepImg *)((long)&params.param + 0x14),iVar2,IEP_CMD_SET_SRC);
    dec_vproc_set_img(ctx,(IepImg *)((long)&params.param + 0x14),iVar2,IEP_CMD_SET_DEI_SRC1);
    dec_vproc_set_img(ctx,(IepImg *)((long)&params.param + 0x14),iVar2,IEP_CMD_SET_DEI_SRC2);
  }
LAB_001a0da3:
  iVar2 = mpp_buffer_get_fd_with_caller(ctx->out_buf0,"dec_vproc_config_dei_v2");
  dec_vproc_set_img(ctx,(IepImg *)((long)&params.param + 0x14),iVar2,IEP_CMD_SET_DST);
  iVar2 = mpp_buffer_get_fd_with_caller(ctx->out_buf1,"dec_vproc_config_dei_v2");
  dec_vproc_set_img(ctx,(IepImg *)((long)&params.param + 0x14),iVar2,IEP_CMD_SET_DEI_DST1);
  memset(&ops,0,0x20);
  ops._0_4_ = 1;
  params.ptype = IEP2_PARAM_TYPE_COM;
  ops._4_4_ = dil_mode;
  RVar3 = mpp_frame_get_mode(frm);
  uVar4 = (uint)((RVar3 & 4) != 0);
  if (((RVar3 & 4) == 0) || ((RVar3 & 8) == 0)) {
    params.param.com.sfmt._1_3_ = 0;
    params.param.com.sfmt._0_1_ = uVar4 == 0;
  }
  else {
    params.param.com.sfmt = IEP2_FMT_YUV422;
  }
  if (ctx->pre_ff_mode == IEP2_FF_MODE_FIELD) {
    local_90 = uVar4;
    if ((ctx->dei_info).dil_order != IEP2_FIELD_ORDER_UND) {
      local_90 = (uint)((ctx->dei_info).dil_order == IEP2_FIELD_ORDER_TFF);
    }
    local_88 = uVar4;
    if ((local_90 != uVar4) && (0x1e < (ctx->dei_info).dil_order_confidence_ratio)) {
      local_88 = local_90;
    }
    params.param.com.sfmt._1_3_ = 0;
    params.param.com.sfmt._0_1_ = local_88 == 0;
    if ((vproc_debug & 2) != 0) {
      _mpp_log_l(4,"mpp_dec_vproc","Config field order: is TFF %d, syn %d vs iep %d\n",
                 "dec_vproc_config_dei_v2",(ulong)local_88,(ulong)uVar4,local_90);
    }
  }
  (*piVar1->control)(ctx->iep_ctx,IEP_CMD_SET_DEI_CFG,&ops);
  memset(&ops,0,0x20);
  ops._0_4_ = 0;
  ops._4_4_ = 3;
  params.param.com.sfmt = IEP2_FMT_YUV420;
  params.ptype = IEP2_PARAM_TYPE_COM;
  params.param.com.sswap = IEP2_YUV_SWAP_SP_UV;
  params.param.com.dfmt = (IEP2_FMT)(ushort)params.param.com.height._0_2_;
  params.param.com.dswap = (IEP2_YUV_SWAP)(ushort)params.param.com.height._2_2_;
  params.param.com.width = (int)img.act_w;
  (*piVar1->control)(ctx->iep_ctx,IEP_CMD_SET_DEI_CFG,&ops);
  return MPP_OK;
}

Assistant:

static MPP_RET dec_vproc_config_dei_v2(MppDecVprocCtxImpl *ctx, MppFrame frm,
                                       enum IEP2_DIL_MODE dil_mode)
{
    MPP_RET ret = MPP_OK;
    MppBuffer buf = NULL;
    RK_S32 fd = -1;
    IepImg img;
    struct iep2_api_params params;
    iep_com_ops *ops = ctx->com_ctx->ops;

    if (!frm) {
        mpp_err("found NULL pointer frm\n");
        ret = MPP_ERR_NULL_PTR;
        return ret;
    }

    /* default alloc 2 out buffer for IEP */
    if (!ctx->out_buf0 || !ctx->out_buf1) {
        mpp_err("found NULL pointer out_buf0 %p out_buf1 %p\n", ctx->out_buf0, ctx->out_buf1);
        ret = MPP_ERR_NULL_PTR;
        return ret;
    }

    // setup source IepImg
    dec_vproc_set_img_fmt(&img, frm);

    if (vproc_debug & VPROC_DBG_DUMP_IN)
        dump_mppbuffer(buf, "/data/dump/dump_in.yuv", img.vir_w, img.vir_h);

    vproc_dbg_status("set dil_mode %d\n", dil_mode);
    // TODO: check the input frame
    switch (dil_mode) {
    case IEP2_DIL_MODE_I5O2:
    case IEP2_DIL_MODE_I5O1T:
    case IEP2_DIL_MODE_I5O1B:
    case IEP2_DIL_MODE_DECT: {
        // require 3 frames
        buf = mpp_frame_get_buffer(ctx->prev_frm0);
        fd = mpp_buffer_get_fd(buf);
        dec_vproc_set_img(ctx, &img, fd, IEP_CMD_SET_SRC);

        buf = mpp_frame_get_buffer(frm);
        fd = mpp_buffer_get_fd(buf);
        dec_vproc_set_img(ctx, &img, fd, IEP_CMD_SET_DEI_SRC1);

        buf = mpp_frame_get_buffer(ctx->prev_frm1);
        fd = mpp_buffer_get_fd(buf);
        dec_vproc_set_img(ctx, &img, fd, IEP_CMD_SET_DEI_SRC2);
    } break;
    case IEP2_DIL_MODE_PD: {
        // require 2 frame
        buf = mpp_frame_get_buffer(frm);
        fd = mpp_buffer_get_fd(buf);
        dec_vproc_set_img(ctx, &img, fd, IEP_CMD_SET_DEI_SRC1);

        if (ctx->prev_frm0) {
            buf = mpp_frame_get_buffer(ctx->prev_frm0);
            fd = mpp_buffer_get_fd(buf);
        } else if (ctx->prev_frm1) {
            buf = mpp_frame_get_buffer(ctx->prev_frm1);
            fd = mpp_buffer_get_fd(buf);
        }

        dec_vproc_set_img(ctx, &img, fd, IEP_CMD_SET_SRC);
        dec_vproc_set_img(ctx, &img, fd, IEP_CMD_SET_DEI_SRC2);
    } break;
    case IEP2_DIL_MODE_I2O2:
    case IEP2_DIL_MODE_I1O1T:
    case IEP2_DIL_MODE_I1O1B:
    case IEP2_DIL_MODE_BYPASS:
    default: {
        buf = mpp_frame_get_buffer(frm);
        fd = mpp_buffer_get_fd(buf);
        dec_vproc_set_img(ctx, &img, fd, IEP_CMD_SET_SRC);
        dec_vproc_set_img(ctx, &img, fd, IEP_CMD_SET_DEI_SRC1);
        dec_vproc_set_img(ctx, &img, fd, IEP_CMD_SET_DEI_SRC2);
    } break;
    }

    // setup output
    fd = mpp_buffer_get_fd(ctx->out_buf0);
    dec_vproc_set_img(ctx, &img, fd, IEP_CMD_SET_DST);
    fd = mpp_buffer_get_fd(ctx->out_buf1);
    dec_vproc_set_img(ctx, &img, fd, IEP_CMD_SET_DEI_DST1);

    memset(&params, 0, sizeof(params));
    params.ptype = IEP2_PARAM_TYPE_MODE;
    params.param.mode.dil_mode = dil_mode;
    params.param.mode.out_mode = IEP2_OUT_MODE_LINE;
    {
        RK_U32 mode = mpp_frame_get_mode(frm);
        RK_U32 fo_from_syntax = (mode & MPP_FRAME_FLAG_TOP_FIRST) ? 1 : 0;

        /* refer to syntax */
        if ((mode & MPP_FRAME_FLAG_TOP_FIRST) && (mode & MPP_FRAME_FLAG_BOT_FIRST))
            params.param.mode.dil_order = IEP2_FIELD_ORDER_UND;
        else if (fo_from_syntax)
            params.param.mode.dil_order = IEP2_FIELD_ORDER_TFF;
        else
            params.param.mode.dil_order = IEP2_FIELD_ORDER_BFF;

        /* refer to IEP */
        if (ctx->pre_ff_mode == IEP2_FF_MODE_FIELD) {
            RK_U32 fo_from_iep = (ctx->dei_info.dil_order == IEP2_FIELD_ORDER_UND) ?
                                 fo_from_syntax : (ctx->dei_info.dil_order == IEP2_FIELD_ORDER_TFF);
            RK_U32 is_tff = 0;

            if (fo_from_iep != fo_from_syntax) {
                if (ctx->dei_info.dil_order_confidence_ratio > 30)
                    is_tff = fo_from_iep;
                else
                    is_tff = fo_from_syntax;
            } else {
                is_tff = fo_from_syntax;
            }

            if (is_tff)
                params.param.mode.dil_order = IEP2_FIELD_ORDER_TFF;
            else
                params.param.mode.dil_order = IEP2_FIELD_ORDER_BFF;

            vproc_dbg_status("Config field order: is TFF %d, syn %d vs iep %d\n",
                             is_tff, fo_from_syntax, fo_from_iep);
        }
    }
    ops->control(ctx->iep_ctx, IEP_CMD_SET_DEI_CFG, &params);

    memset(&params, 0, sizeof(params));
    params.ptype = IEP2_PARAM_TYPE_COM;
    params.param.com.sfmt = IEP2_FMT_YUV420;
    params.param.com.dfmt = IEP2_FMT_YUV420;
    params.param.com.sswap = IEP2_YUV_SWAP_SP_UV;
    params.param.com.dswap = IEP2_YUV_SWAP_SP_UV;
    params.param.com.width = img.act_w;
    params.param.com.height = img.act_h;
    params.param.com.hor_stride = img.vir_w;//img.act_w;
    ops->control(ctx->iep_ctx, IEP_CMD_SET_DEI_CFG, &params);

    return MPP_OK;
}